

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

bool __thiscall
google::protobuf::DescriptorPool::TryFindSymbolInFallbackDatabase(DescriptorPool *this,string *name)

{
  Tables *pTVar1;
  bool bVar2;
  int iVar3;
  const_iterator cVar4;
  const_iterator cVar5;
  FileDescriptor *pFVar6;
  __node_gen_type __node_gen;
  FileDescriptorProto file_proto;
  _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,google::protobuf::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  *local_f8;
  FileDescriptorProto local_f0;
  
  if (this->fallback_database_ == (DescriptorDatabase *)0x0) {
    return false;
  }
  pTVar1 = (this->tables_).ptr_;
  if (pTVar1 != (Tables *)0x0) {
    cVar4 = std::
            _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
            ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_google::protobuf::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                    *)&pTVar1->known_bad_symbols_,name);
    if (cVar4.
        super__Node_iterator_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
        ._M_cur != (__node_type *)0x0) {
      return false;
    }
    FileDescriptorProto::FileDescriptorProto(&local_f0);
    bVar2 = IsSubSymbolOfBuiltType(this,name);
    if ((!bVar2) &&
       (iVar3 = (*this->fallback_database_->_vptr_DescriptorDatabase[3])
                          (this->fallback_database_,name,&local_f0), (char)iVar3 != '\0')) {
      pTVar1 = (this->tables_).ptr_;
      if (pTVar1 == (Tables *)0x0) goto LAB_002d3ca3;
      local_f8 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,google::protobuf::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)((local_f0.name_.ptr_)->_M_dataplus)._M_p;
      cVar5 = std::
              _Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
              ::find((_Hashtable<const_char_*,_std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_std::allocator<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>_>,_std::__detail::_Select1st,_google::protobuf::streq,_google::protobuf::hash<const_char_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                      *)&pTVar1->files_by_name_,(key_type *)&local_f8);
      if ((cVar5.
           super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
           ._M_cur == (__node_type *)0x0) ||
         (*(long *)((long)cVar5.
                          super__Node_iterator_base<std::pair<const_char_*const,_const_google::protobuf::FileDescriptor_*>,_true>
                          ._M_cur + 0x10) == 0)) {
        pFVar6 = BuildFileFromDatabase(this,&local_f0);
        bVar2 = true;
        if (pFVar6 != (FileDescriptor *)0x0) goto LAB_002d3c8b;
      }
    }
    pTVar1 = (this->tables_).ptr_;
    if (pTVar1 != (Tables *)0x0) {
      local_f8 = (_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,google::protobuf::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&pTVar1->known_bad_symbols_;
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,google::protobuf::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::
      _M_insert<std::__cxx11::string_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::__cxx11::string,true>>>>
                (local_f8,name);
      bVar2 = false;
LAB_002d3c8b:
      FileDescriptorProto::~FileDescriptorProto(&local_f0);
      return bVar2;
    }
  }
LAB_002d3ca3:
  __assert_fail("ptr_ != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/stubs/scoped_ptr.h"
                ,0x5f,
                "C *google::protobuf::internal::scoped_ptr<google::protobuf::DescriptorPool::Tables>::operator->() const [C = google::protobuf::DescriptorPool::Tables]"
               );
}

Assistant:

bool DescriptorPool::TryFindSymbolInFallbackDatabase(const string& name) const {
  if (fallback_database_ == NULL) return false;

  if (tables_->known_bad_symbols_.count(name) > 0) return false;

  FileDescriptorProto file_proto;
  if (// We skip looking in the fallback database if the name is a sub-symbol
      // of any descriptor that already exists in the descriptor pool (except
      // for package descriptors).  This is valid because all symbols except
      // for packages are defined in a single file, so if the symbol exists
      // then we should already have its definition.
      //
      // The other reason to do this is to support "overriding" type
      // definitions by merging two databases that define the same type.  (Yes,
      // people do this.)  The main difficulty with making this work is that
      // FindFileContainingSymbol() is allowed to return both false positives
      // (e.g., SimpleDescriptorDatabase, UpgradedDescriptorDatabase) and false
      // negatives (e.g. ProtoFileParser, SourceTreeDescriptorDatabase).
      // When two such databases are merged, looking up a non-existent
      // sub-symbol of a type that already exists in the descriptor pool can
      // result in an attempt to load multiple definitions of the same type.
      // The check below avoids this.
      IsSubSymbolOfBuiltType(name)

      // Look up file containing this symbol in fallback database.
      || !fallback_database_->FindFileContainingSymbol(name, &file_proto)

      // Check if we've already built this file. If so, it apparently doesn't
      // contain the symbol we're looking for.  Some DescriptorDatabases
      // return false positives.
      || tables_->FindFile(file_proto.name()) != NULL

      // Build the file.
      || BuildFileFromDatabase(file_proto) == NULL) {
    tables_->known_bad_symbols_.insert(name);
    return false;
  }

  return true;
}